

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_input(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  byte *pbVar1;
  ptls_buffer_t *buf_00;
  anon_struct_16_3_80f1ae39_for_server *paVar2;
  uint8_t *puVar3;
  st_ptls_hash_context_t *psVar4;
  ptls_cipher_suite_t *ppVar5;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var6;
  st_ptls_verify_certificate_t *psVar7;
  st_ptls_key_exchange_context_t *psVar8;
  st_ptls_save_ticket_t *psVar9;
  st_ptls_encrypt_ticket_t *psVar10;
  st_ptls_lookup_certificate_t *psVar11;
  anon_enum_32 aVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ptls_iovec_t ikm;
  ptls_iovec_t pVar20;
  ptls_iovec_t ikm_00;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  anon_enum_32 aVar37;
  ptls_key_exchange_algorithm_t *ppVar38;
  uint8_t uVar39;
  ushort uVar40;
  int iVar41;
  anon_enum_32 aVar42;
  uint uVar43;
  ushort *puVar44;
  uint64_t uVar45;
  void *pvVar46;
  char *pcVar47;
  ushort *puVar48;
  byte *pbVar49;
  st_ptls_key_schedule_t *psVar50;
  st_ptls_early_data_receiver_t *psVar51;
  ushort uVar52;
  long lVar53;
  ulong uVar54;
  ushort *puVar55;
  long lVar56;
  undefined1 *puVar57;
  ulong *puVar58;
  char *context_string;
  size_t i;
  byte *pbVar59;
  uint8_t *end;
  ptls_key_exchange_algorithm_t *ppVar60;
  ptls_key_exchange_algorithm_t **pppVar61;
  size_t sVar62;
  short sVar63;
  ptls_cipher_suite_t **pppVar64;
  ulong uVar65;
  size_t sVar66;
  ushort *puVar67;
  byte bVar68;
  ushort *puVar69;
  ulong uVar70;
  size_t sVar71;
  uint8_t *src;
  size_t *psVar72;
  size_t sVar73;
  size_t sVar74;
  size_t sVar75;
  bool bVar76;
  ptls_iovec_t pVar77;
  ptls_iovec_t pVar78;
  ptls_iovec_t pVar79;
  ptls_iovec_t message;
  ptls_iovec_t message_00;
  ptls_iovec_t pVar80;
  ptls_iovec_t ikm_01;
  ptls_iovec_t pVar81;
  size_t local_4f8;
  ushort *local_4f0;
  ushort local_4e8;
  ulong local_4e0;
  uint16_t sign_algorithm;
  ushort *local_4d0;
  uint16_t ticket_csid;
  ushort *local_4c0;
  ptls_buffer_t *local_4b8;
  undefined1 local_4ad;
  undefined1 local_4ac;
  undefined1 local_4ab;
  undefined1 local_4aa;
  undefined1 local_4a9;
  st_ptls_record_t local_4a8;
  ptls_key_exchange_algorithm_t **local_488;
  ulong local_480;
  undefined8 local_478;
  uint32_t age_add;
  ushort local_46a;
  undefined2 local_468;
  undefined2 local_466;
  ushort local_464;
  undefined2 local_462;
  byte *local_460;
  ulong local_458;
  void *signer_data;
  _func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t *signer;
  size_t num_certs;
  ptls_iovec_t *certs;
  uint64_t issue_at;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t ticket_psk;
  uint16_t group;
  undefined6 uStack_3e6;
  size_t local_3e0;
  size_t local_3d8;
  int local_3d0;
  uint32_t max_early_data_size;
  uint8_t binder_key [64];
  st_ptls_server_hello_t sh;
  undefined8 local_308;
  undefined8 uStack_300;
  size_t local_2f8;
  ptls_key_exchange_algorithm_t *local_2f0;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  uint8_t auStack_2e0 [4];
  uint8_t auStack_2dc [20];
  ushort *local_2c8;
  uint8_t local_2c0 [4];
  uint8_t auStack_2bc [4];
  uint8_t local_2b8 [4];
  uint8_t auStack_2b4 [4];
  uint8_t auStack_2b0 [8];
  uint8_t local_2a8 [8];
  ulong local_2a0 [16];
  ulong local_220;
  uint local_218;
  int local_214;
  uint8_t finished_key [64];
  
  uVar13._4_4_ = uStack_2e4;
  uVar13._0_4_ = local_2e8;
  buf = &tls->recvbuf;
  puVar3 = (tls->recvbuf).rec.base;
  uVar70 = *inlen;
  if (uVar70 < 5 || puVar3 != (uint8_t *)0x0) {
    local_4a8.fragment = (uint8_t *)0x0;
    local_4a8.type = '\0';
    local_4a8._1_1_ = 0;
    local_4a8.version = 0;
    local_4a8._4_4_ = 0;
    local_4a8.length = 0;
    if (puVar3 == (uint8_t *)0x0) goto LAB_0010d81e;
LAB_0010d846:
    pbVar49 = (byte *)(uVar70 + (long)input);
    puVar69 = (ushort *)(pbVar49 + -(long)input);
    while (pbVar59 = (byte *)(tls->recvbuf).rec.off, pbVar59 < (byte *)0x5) {
      if ((byte *)input == pbVar49) {
        return 0x202;
      }
      bVar68 = *input;
      input = (void *)((long)input + 1);
      puVar3 = (tls->recvbuf).rec.base;
      (tls->recvbuf).rec.off = (size_t)(pbVar59 + 1);
      pbVar59[(long)puVar3] = bVar68;
      puVar69 = (ushort *)((long)puVar69 + -1);
    }
    local_4b8 = sendbuf;
    iVar41 = parse_record_header(&local_4a8,(buf->rec).base);
    sVar66 = local_4a8.length;
    if (iVar41 != 0) {
      return iVar41;
    }
    pbVar1 = (byte *)(local_4a8.length + 5);
    puVar44 = (ushort *)(pbVar1 + -(long)pbVar59);
    if (puVar44 != (ushort *)0x0) {
      iVar41 = ptls_buffer_reserve(&buf->rec,(size_t)puVar44);
      if (iVar41 != 0) {
        return iVar41;
      }
      puVar67 = puVar69;
      if (puVar44 < puVar69) {
        puVar67 = puVar44;
      }
      pbVar59 = (byte *)(tls->recvbuf).rec.off;
      if (puVar67 != (ushort *)0x0) {
        local_4d0 = puVar44;
        memcpy(pbVar59 + (long)(tls->recvbuf).rec.base,input,(size_t)puVar67);
        pbVar59 = (byte *)((long)puVar67 + (tls->recvbuf).rec.off);
        (tls->recvbuf).rec.off = (size_t)pbVar59;
        puVar44 = local_4d0;
        if (puVar69 < local_4d0) {
          puVar44 = puVar69;
        }
        input = (void *)((long)input + (long)puVar44);
      }
    }
    iVar41 = 0x202;
    if (pbVar59 == pbVar1) {
      local_4a8.fragment = (buf->rec).base + 5;
      iVar41 = 0;
    }
    *inlen = (size_t)((long)input + (*inlen - (long)pbVar49));
    if (pbVar59 != pbVar1) {
      return iVar41;
    }
    sendbuf = local_4b8;
    if (local_4a8.fragment == (uint8_t *)0x0) {
      __assert_fail("rec.fragment != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                    ,0x88e,
                    "int handle_input(ptls_t *, ptls_buffer_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
  }
  else {
    iVar41 = parse_record_header(&local_4a8,(uint8_t *)input);
    if (iVar41 != 0) {
      return iVar41;
    }
    if (uVar70 < local_4a8.length + 5) {
LAB_0010d81e:
      local_4a8.fragment = (uint8_t *)0x0;
      local_4a8.length = 0;
      local_4a8.type = '\0';
      local_4a8._1_1_ = 0;
      local_4a8.version = 0;
      local_4a8._4_4_ = 0;
      (tls->recvbuf).rec.base = "";
      (tls->recvbuf).rec.capacity = 0;
      (tls->recvbuf).rec.off = 0;
      (tls->recvbuf).rec.is_allocated = 0;
      iVar41 = ptls_buffer_reserve(&buf->rec,5);
      if (iVar41 != 0) {
        return iVar41;
      }
      goto LAB_0010d846;
    }
    local_4a8.fragment = (uint8_t *)((long)input + 5);
    *inlen = local_4a8.length + 5;
    sVar66 = local_4a8.length;
  }
  puVar3 = local_4a8.fragment;
  uVar39 = local_4a8.type;
  if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
    if (local_4a8.type != '\x17') {
      return 0x28;
    }
    iVar41 = ptls_buffer_reserve(decryptbuf,sVar66 + 5);
    if (iVar41 != 0) {
      return iVar41;
    }
    iVar41 = ptls_aead_transform((tls->traffic_protection).dec.aead,
                                 decryptbuf->base + decryptbuf->off,&local_4a8.length,puVar3,sVar66,
                                 '\0');
    uVar14._4_1_ = finished_key[4];
    uVar14._5_1_ = finished_key[5];
    uVar14._6_1_ = finished_key[6];
    uVar14._7_1_ = finished_key[7];
    uVar14._0_1_ = finished_key[0];
    uVar14._1_1_ = finished_key[1];
    uVar14._2_1_ = finished_key[2];
    uVar14._3_1_ = finished_key[3];
    bVar68 = *(byte *)&(tls->field_7).server;
    if (iVar41 != 0) {
      aVar42 = 0x202;
      if ((bVar68 & 2) == 0) {
        return iVar41;
      }
      goto LAB_0010e17a;
    }
    *(byte *)&(tls->field_7).server = bVar68 & 0xfd;
    local_4a8.fragment = decryptbuf->base + decryptbuf->off;
    do {
      sVar66 = local_4a8.length - 1;
      if (local_4a8.length == 0) {
        return 10;
      }
      lVar53 = local_4a8.length - 1;
      local_4a8.length = sVar66;
    } while (local_4a8.fragment[lVar53] == '\0');
    uVar39 = local_4a8.fragment[sVar66];
    local_4a8.type = uVar39;
  }
  src = local_4a8.fragment;
  uVar14._4_1_ = finished_key[4];
  uVar14._5_1_ = finished_key[5];
  uVar14._6_1_ = finished_key[6];
  uVar14._7_1_ = finished_key[7];
  uVar14._0_1_ = finished_key[0];
  uVar14._1_1_ = finished_key[1];
  uVar14._2_1_ = finished_key[2];
  uVar14._3_1_ = finished_key[3];
  uVar36._4_1_ = finished_key[4];
  uVar36._5_1_ = finished_key[5];
  uVar36._6_1_ = finished_key[6];
  uVar36._7_1_ = finished_key[7];
  uVar36._0_1_ = finished_key[0];
  uVar36._1_1_ = finished_key[1];
  uVar36._2_1_ = finished_key[2];
  uVar36._3_1_ = finished_key[3];
  uVar19._4_1_ = finished_key[4];
  uVar19._5_1_ = finished_key[5];
  uVar19._6_1_ = finished_key[6];
  uVar19._7_1_ = finished_key[7];
  uVar19._0_1_ = finished_key[0];
  uVar19._1_1_ = finished_key[1];
  uVar19._2_1_ = finished_key[2];
  uVar19._3_1_ = finished_key[3];
  uVar18._4_1_ = finished_key[4];
  uVar18._5_1_ = finished_key[5];
  uVar18._6_1_ = finished_key[6];
  uVar18._7_1_ = finished_key[7];
  uVar18._0_1_ = finished_key[0];
  uVar18._1_1_ = finished_key[1];
  uVar18._2_1_ = finished_key[2];
  uVar18._3_1_ = finished_key[3];
  uVar17._4_1_ = finished_key[4];
  uVar17._5_1_ = finished_key[5];
  uVar17._6_1_ = finished_key[6];
  uVar17._7_1_ = finished_key[7];
  uVar17._0_1_ = finished_key[0];
  uVar17._1_1_ = finished_key[1];
  uVar17._2_1_ = finished_key[2];
  uVar17._3_1_ = finished_key[3];
  uVar16._4_1_ = finished_key[4];
  uVar16._5_1_ = finished_key[5];
  uVar16._6_1_ = finished_key[6];
  uVar16._7_1_ = finished_key[7];
  uVar16._0_1_ = finished_key[0];
  uVar16._1_1_ = finished_key[1];
  uVar16._2_1_ = finished_key[2];
  uVar16._3_1_ = finished_key[3];
  uVar15._4_1_ = finished_key[4];
  uVar15._5_1_ = finished_key[5];
  uVar15._6_1_ = finished_key[6];
  uVar15._7_1_ = finished_key[7];
  uVar15._0_1_ = finished_key[0];
  uVar15._1_1_ = finished_key[1];
  uVar15._2_1_ = finished_key[2];
  uVar15._3_1_ = finished_key[3];
  puVar3 = (tls->recvbuf).mess.base;
  if ((puVar3 == (uint8_t *)0x0) && (uVar39 != '\x16')) {
    if (uVar39 != '\x15') {
      aVar42 = PTLS_STATE_SERVER_POST_HANDSHAKE;
      uVar14 = uVar15;
      if (uVar39 != '\x17') goto LAB_0010e17a;
      if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
        uVar14 = uVar16;
        if ((tls->state == PTLS_STATE_SERVER_EXPECT_FINISHED) &&
           (aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START, uVar14 = uVar17,
           (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
          decryptbuf->off = decryptbuf->off + sVar66;
          uVar14 = uVar18;
        }
        goto LAB_0010e17a;
      }
      decryptbuf->off = decryptbuf->off + sVar66;
LAB_0010da8c:
      uVar14._4_1_ = finished_key[4];
      uVar14._5_1_ = finished_key[5];
      uVar14._6_1_ = finished_key[6];
      uVar14._7_1_ = finished_key[7];
      uVar14._0_1_ = finished_key[0];
      uVar14._1_1_ = finished_key[1];
      uVar14._2_1_ = finished_key[2];
      uVar14._3_1_ = finished_key[3];
      aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START;
      goto LAB_0010e17a;
    }
    if (sVar66 != 2) {
      aVar42 = 0x32;
      goto LAB_0010e17a;
    }
    bVar68 = local_4a8.fragment[1];
    if (*local_4a8.fragment == '\x01') {
      aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START;
      uVar14 = uVar19;
      if (bVar68 == 0x5a) goto LAB_0010e17a;
      if (bVar68 != 1) goto LAB_0010dc85;
      psVar51 = (tls->field_7).server.early_data;
      uVar14 = uVar36;
      if (psVar51 == (st_ptls_early_data_receiver_t *)0x0) goto LAB_0010e17a;
      uVar13 = *(undefined8 *)psVar51->next_secret;
      uVar14 = *(undefined8 *)(psVar51->next_secret + 8);
      uVar15 = *(undefined8 *)(psVar51->next_secret + 0x10);
      uVar16 = *(undefined8 *)(psVar51->next_secret + 0x18);
      uVar17 = *(undefined8 *)(psVar51->next_secret + 0x20);
      uVar18 = *(undefined8 *)(psVar51->next_secret + 0x28);
      uVar19 = *(undefined8 *)(psVar51->next_secret + 0x38);
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x30) =
           *(undefined8 *)(psVar51->next_secret + 0x30);
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x38) = uVar19;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x20) = uVar17;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x28) = uVar18;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x10) = uVar15;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x18) = uVar16;
      *(undefined8 *)(tls->traffic_protection).dec.secret = uVar13;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 8) = uVar14;
      (*ptls_clear_memory)(psVar51,0x40);
      free((tls->field_7).server.early_data);
      (tls->field_7).server.early_data = (st_ptls_early_data_receiver_t *)0x0;
      aVar42 = setup_traffic_protection(tls,tls->cipher_suite,0,(char *)0x0);
    }
    else {
LAB_0010dc85:
      aVar42 = bVar68 | 0x100;
    }
    uVar14._4_1_ = finished_key[4];
    uVar14._5_1_ = finished_key[5];
    uVar14._6_1_ = finished_key[6];
    uVar14._7_1_ = finished_key[7];
    uVar14._0_1_ = finished_key[0];
    uVar14._1_1_ = finished_key[1];
    uVar14._2_1_ = finished_key[2];
    uVar14._3_1_ = finished_key[3];
    goto LAB_0010e17a;
  }
  if (uVar39 != '\x16') {
    return 0x32;
  }
  buf_00 = &(tls->recvbuf).mess;
  if ((puVar3 != (uint8_t *)0x0) ||
     (iVar41 = test_handshake_message(local_4a8.fragment,sVar66), iVar41 != 0)) {
    iVar41 = ptls_buffer_reserve(buf_00,sVar66);
    if (iVar41 != 0) {
      return iVar41;
    }
    memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,local_4a8.fragment,local_4a8.length);
    src = (tls->recvbuf).mess.base;
    sVar66 = (tls->recvbuf).mess.off + local_4a8.length;
    (tls->recvbuf).mess.off = sVar66;
    aVar42 = test_handshake_message(src,sVar66);
    uVar14._4_1_ = finished_key[4];
    uVar14._5_1_ = finished_key[5];
    uVar14._6_1_ = finished_key[6];
    uVar14._7_1_ = finished_key[7];
    uVar14._0_1_ = finished_key[0];
    uVar14._1_1_ = finished_key[1];
    uVar14._2_1_ = finished_key[2];
    uVar14._3_1_ = finished_key[3];
    if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010e17a;
    if (src == (uint8_t *)0x0) goto LAB_0010da8c;
  }
  uVar30._4_1_ = finished_key[4];
  uVar30._5_1_ = finished_key[5];
  uVar30._6_1_ = finished_key[6];
  uVar30._7_1_ = finished_key[7];
  uVar30._0_1_ = finished_key[0];
  uVar30._1_1_ = finished_key[1];
  uVar30._2_1_ = finished_key[2];
  uVar30._3_1_ = finished_key[3];
  uVar29._4_1_ = finished_key[4];
  uVar29._5_1_ = finished_key[5];
  uVar29._6_1_ = finished_key[6];
  uVar29._7_1_ = finished_key[7];
  uVar29._0_1_ = finished_key[0];
  uVar29._1_1_ = finished_key[1];
  uVar29._2_1_ = finished_key[2];
  uVar29._3_1_ = finished_key[3];
  uVar28._4_1_ = finished_key[4];
  uVar28._5_1_ = finished_key[5];
  uVar28._6_1_ = finished_key[6];
  uVar28._7_1_ = finished_key[7];
  uVar28._0_1_ = finished_key[0];
  uVar28._1_1_ = finished_key[1];
  uVar28._2_1_ = finished_key[2];
  uVar28._3_1_ = finished_key[3];
  uVar27._4_1_ = finished_key[4];
  uVar27._5_1_ = finished_key[5];
  uVar27._6_1_ = finished_key[6];
  uVar27._7_1_ = finished_key[7];
  uVar27._0_1_ = finished_key[0];
  uVar27._1_1_ = finished_key[1];
  uVar27._2_1_ = finished_key[2];
  uVar27._3_1_ = finished_key[3];
  uVar26._4_1_ = finished_key[4];
  uVar26._5_1_ = finished_key[5];
  uVar26._6_1_ = finished_key[6];
  uVar26._7_1_ = finished_key[7];
  uVar26._0_1_ = finished_key[0];
  uVar26._1_1_ = finished_key[1];
  uVar26._2_1_ = finished_key[2];
  uVar26._3_1_ = finished_key[3];
  uVar24._4_1_ = finished_key[4];
  uVar24._5_1_ = finished_key[5];
  uVar24._6_1_ = finished_key[6];
  uVar24._7_1_ = finished_key[7];
  uVar24._0_1_ = finished_key[0];
  uVar24._1_1_ = finished_key[1];
  uVar24._2_1_ = finished_key[2];
  uVar24._3_1_ = finished_key[3];
  aVar42 = tls->state;
  if (8 < aVar42 - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO) {
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x860,
                  "int handle_handshake_message(ptls_t *, ptls_buffer_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  uVar39 = *src;
  switch(aVar42) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    if (uVar39 != '\x02') {
LAB_0010e169:
      aVar42 = PTLS_STATE_SERVER_POST_HANDSHAKE;
      goto LAB_0010e16b;
    }
    finished_key[0] = '\0';
    finished_key[1] = '\0';
    finished_key[2] = '\0';
    finished_key[3] = '\0';
    finished_key[4] = '\0';
    finished_key[5] = '\0';
    finished_key[6] = '\0';
    finished_key[7] = '\0';
    uVar32._0_1_ = '\0';
    uVar32._1_1_ = '\0';
    uVar32._2_1_ = '\0';
    uVar32._3_1_ = '\0';
    uVar32._4_1_ = '\0';
    uVar32._5_1_ = '\0';
    uVar32._6_1_ = '\0';
    uVar32._7_1_ = '\0';
    uVar31._0_1_ = '\0';
    uVar31._1_1_ = '\0';
    uVar31._2_1_ = '\0';
    uVar31._3_1_ = '\0';
    uVar31._4_1_ = '\0';
    uVar31._5_1_ = '\0';
    uVar31._6_1_ = '\0';
    uVar31._7_1_ = '\0';
    uVar24._0_1_ = '\0';
    uVar24._1_1_ = '\0';
    uVar24._2_1_ = '\0';
    uVar24._3_1_ = '\0';
    uVar24._4_1_ = '\0';
    uVar24._5_1_ = '\0';
    uVar24._6_1_ = '\0';
    uVar24._7_1_ = '\0';
    finished_key[8] = '\0';
    finished_key[9] = '\0';
    finished_key[10] = '\0';
    finished_key[0xb] = '\0';
    finished_key[0xc] = '\0';
    finished_key[0xd] = '\0';
    finished_key[0xe] = '\0';
    finished_key[0xf] = '\0';
    sh.random[0] = '\0';
    sh.random[1] = '\0';
    sh.random[2] = '\0';
    sh.random[3] = '\0';
    sh.random[4] = '\0';
    sh.random[5] = '\0';
    sh.random[6] = '\0';
    sh.random[7] = '\0';
    sh.random[8] = '\0';
    sh.random[9] = '\0';
    sh.random[10] = '\0';
    sh.random[0xb] = '\0';
    sh.random[0xc] = '\0';
    sh.random[0xd] = '\0';
    sh.random[0xe] = '\0';
    sh.random[0xf] = '\0';
    sh.random[0x10] = '\0';
    sh.random[0x11] = '\0';
    sh.random[0x12] = '\0';
    sh.random[0x13] = '\0';
    sh.random[0x14] = '\0';
    sh.random[0x15] = '\0';
    sh.random[0x16] = '\0';
    sh.random[0x17] = '\0';
    sh.random[0x18] = '\0';
    sh.random[0x19] = '\0';
    sh.random[0x1a] = '\0';
    sh.random[0x1b] = '\0';
    sh.random[0x1c] = '\0';
    sh.random[0x1d] = '\0';
    sh.random[0x1e] = '\0';
    sh.random[0x1f] = '\0';
    sh.peerkey.base = (uint8_t *)0x0;
    sh.peerkey.len = 0;
    aVar42 = 0x32;
    if (5 < (long)sVar66) {
      if ((ushort)(*(ushort *)(src + 4) << 8 | *(ushort *)(src + 4) >> 8) == 0x7f12) {
        uVar24 = uVar31;
        if (0x27 < sVar66) {
          pppVar64 = tls->ctx->cipher_suites;
          do {
            ppVar5 = *pppVar64;
            if (ppVar5 == (ptls_cipher_suite_t *)0x0) goto LAB_0010e4f2;
            pppVar64 = pppVar64 + 1;
          } while (ppVar5->id !=
                   (uint16_t)(*(ushort *)(src + 0x26) << 8 | *(ushort *)(src + 0x26) >> 8));
          tls->cipher_suite = ppVar5;
          if ((sVar66 & 0x7ffffffffffffffe) != 0x28) {
            uVar70 = (ulong)(ushort)(*(ushort *)(src + 0x28) << 8 | *(ushort *)(src + 0x28) >> 8);
            binder_key._0_8_ = src + 0x2a;
            uVar24 = uVar32;
            if (uVar70 <= sVar66 - 0x2a) {
              puVar3 = (uint8_t *)(binder_key._0_8_ + uVar70);
              local_4e8 = 0xffff;
              local_4b8 = (ptls_buffer_t *)((ulong)local_4b8 & 0xffffffff00000000);
LAB_0010e3b1:
              do {
                uVar33._4_1_ = finished_key[4];
                uVar33._5_1_ = finished_key[5];
                uVar33._6_1_ = finished_key[6];
                uVar33._7_1_ = finished_key[7];
                uVar33._0_1_ = finished_key[0];
                uVar33._1_1_ = finished_key[1];
                uVar33._2_1_ = finished_key[2];
                uVar33._3_1_ = finished_key[3];
                uVar24._4_1_ = finished_key[4];
                uVar24._5_1_ = finished_key[5];
                uVar24._6_1_ = finished_key[6];
                uVar24._7_1_ = finished_key[7];
                uVar24._0_1_ = finished_key[0];
                uVar24._1_1_ = finished_key[1];
                uVar24._2_1_ = finished_key[2];
                uVar24._3_1_ = finished_key[3];
                lVar53 = binder_key._0_8_;
                if ((uint8_t *)binder_key._0_8_ == puVar3) {
                  aVar42 = 0x32;
                  if (puVar3 != src + sVar66) goto switchD_0010db48_caseD_a;
                  if (local_4e8 != 0xffff) {
                    bVar68 = (tls->field_7).client.field_0x20;
                    if (local_4e8 != 0 || (bVar68 & 1) == 0) goto LAB_0010f0f6;
                    (tls->field_7).client.field_0x20 = bVar68 | 4;
                  }
                  if (sh.peerkey.base == (uint8_t *)0x0) {
                    bVar68 = (tls->field_7).client.field_0x20;
                    aVar42 = 0x2f;
                    uVar24 = uVar33;
                    if ((bVar68 & 4) == 0) goto switchD_0010db48_caseD_a;
                  }
                  else {
                    psVar8 = (tls->field_7).client.key_exchange.ctx;
                    pVar77.len = sh.peerkey.len;
                    pVar77.base = sh.peerkey.base;
                    aVar42 = (*psVar8->on_exchange)(psVar8,(ptls_iovec_t *)finished_key,pVar77);
                    if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010e4f4;
                    bVar68 = (tls->field_7).client.field_0x20;
                  }
                  if ((bVar68 & 5) == 1) {
                    psVar50 = tls->key_schedule;
                    if (psVar50->generation != 1) {
                      __assert_fail("sched->generation == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                                    ,0x223,
                                    "int key_schedule_reset_psk(struct st_ptls_key_schedule_t *)");
                    }
                    psVar50->secret[0x2c] = '\0';
                    psVar50->secret[0x2d] = '\0';
                    psVar50->secret[0x2e] = '\0';
                    psVar50->secret[0x2f] = '\0';
                    psVar50->secret[0x30] = '\0';
                    psVar50->secret[0x31] = '\0';
                    psVar50->secret[0x32] = '\0';
                    psVar50->secret[0x33] = '\0';
                    psVar50->secret[0x34] = '\0';
                    psVar50->secret[0x35] = '\0';
                    psVar50->secret[0x36] = '\0';
                    psVar50->secret[0x37] = '\0';
                    psVar50->secret[0x38] = '\0';
                    psVar50->secret[0x39] = '\0';
                    psVar50->secret[0x3a] = '\0';
                    psVar50->secret[0x3b] = '\0';
                    psVar50->secret[0x1c] = '\0';
                    psVar50->secret[0x1d] = '\0';
                    psVar50->secret[0x1e] = '\0';
                    psVar50->secret[0x1f] = '\0';
                    psVar50->secret[0x20] = '\0';
                    psVar50->secret[0x21] = '\0';
                    psVar50->secret[0x22] = '\0';
                    psVar50->secret[0x23] = '\0';
                    psVar50->secret[0x24] = '\0';
                    psVar50->secret[0x25] = '\0';
                    psVar50->secret[0x26] = '\0';
                    psVar50->secret[0x27] = '\0';
                    psVar50->secret[0x28] = '\0';
                    psVar50->secret[0x29] = '\0';
                    psVar50->secret[0x2a] = '\0';
                    psVar50->secret[0x2b] = '\0';
                    psVar50->secret[0xc] = '\0';
                    psVar50->secret[0xd] = '\0';
                    psVar50->secret[0xe] = '\0';
                    psVar50->secret[0xf] = '\0';
                    psVar50->secret[0x10] = '\0';
                    psVar50->secret[0x11] = '\0';
                    psVar50->secret[0x12] = '\0';
                    psVar50->secret[0x13] = '\0';
                    psVar50->secret[0x14] = '\0';
                    psVar50->secret[0x15] = '\0';
                    psVar50->secret[0x16] = '\0';
                    psVar50->secret[0x17] = '\0';
                    psVar50->secret[0x18] = '\0';
                    psVar50->secret[0x19] = '\0';
                    psVar50->secret[0x1a] = '\0';
                    psVar50->secret[0x1b] = '\0';
                    psVar50->generation = 0;
                    psVar50->secret[0] = '\0';
                    psVar50->secret[1] = '\0';
                    psVar50->secret[2] = '\0';
                    psVar50->secret[3] = '\0';
                    psVar50->secret[4] = '\0';
                    psVar50->secret[5] = '\0';
                    psVar50->secret[6] = '\0';
                    psVar50->secret[7] = '\0';
                    psVar50->secret[8] = '\0';
                    psVar50->secret[9] = '\0';
                    psVar50->secret[10] = '\0';
                    psVar50->secret[0xb] = '\0';
                    psVar50->secret[0x3c] = '\0';
                    psVar50->secret[0x3d] = '\0';
                    psVar50->secret[0x3e] = '\0';
                    psVar50->secret[0x3f] = '\0';
                    key_schedule_extract(psVar50,(ptls_iovec_t)ZEXT816(0));
                  }
                  psVar4 = tls->key_schedule->msghash;
                  (*psVar4->update)(psVar4,src,sVar66);
                  ikm_00.base._4_1_ = finished_key[4];
                  ikm_00.base._5_1_ = finished_key[5];
                  ikm_00.base._6_1_ = finished_key[6];
                  ikm_00.base._7_1_ = finished_key[7];
                  ikm_00.base._0_1_ = finished_key[0];
                  ikm_00.base._1_1_ = finished_key[1];
                  ikm_00.base._2_1_ = finished_key[2];
                  ikm_00.base._3_1_ = finished_key[3];
                  ikm_00.len._0_1_ = finished_key[8];
                  ikm_00.len._1_1_ = finished_key[9];
                  ikm_00.len._2_1_ = finished_key[10];
                  ikm_00.len._3_1_ = finished_key[0xb];
                  ikm_00.len._4_1_ = finished_key[0xc];
                  ikm_00.len._5_1_ = finished_key[0xd];
                  ikm_00.len._6_1_ = finished_key[0xe];
                  ikm_00.len._7_1_ = finished_key[0xf];
                  aVar42 = key_schedule_extract(tls->key_schedule,ikm_00);
                  if (((aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) &&
                      (aVar42 = setup_traffic_protection
                                          (tls,tls->cipher_suite,1,"client handshake traffic secret"
                                          ), aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START)) &&
                     (aVar42 = setup_traffic_protection
                                         (tls,tls->cipher_suite,0,"server handshake traffic secret")
                     , aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START)) {
                    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                    aVar42 = 0x202;
                  }
                  goto LAB_0010e4f4;
                }
                if ((long)puVar3 - binder_key._0_8_ < 2) break;
                uVar40 = *(ushort *)binder_key._0_8_;
                uVar52 = uVar40 << 8 | uVar40 >> 8;
                lVar53 = binder_key._0_8_ + 2;
                uVar43 = (uint)uVar52;
                if (uVar52 < 8) {
                  if (((byte)local_4b8 >> (uVar43 & 0x1f) & 1) == 0) {
                    uVar70 = (ulong)(uint)(1 << ((byte)(uVar40 >> 8) & 0x1f)) & 0xffffffffffffff07;
                    local_4b8 = (ptls_buffer_t *)
                                CONCAT44(local_4b8._4_4_,
                                         (int)CONCAT71((int7)(uVar70 >> 8),
                                                       (byte)uVar70 | (byte)local_4b8));
                    goto LAB_0010e40d;
                  }
LAB_0010f0f6:
                  binder_key._0_8_ = lVar53;
                  aVar42 = 0x2f;
                  goto LAB_0010e4f4;
                }
LAB_0010e40d:
                if ((ulong)((long)puVar3 - lVar53) < 2) break;
                uVar40 = *(ushort *)(binder_key._0_8_ + 2) << 8 |
                         *(ushort *)(binder_key._0_8_ + 2) >> 8;
                lVar53 = binder_key._0_8_ + 4;
                if (((ulong)((long)puVar3 - lVar53) < (ulong)uVar40) || (uVar52 == 0x2b)) break;
                end = (uint8_t *)(lVar53 + (ulong)uVar40);
                if (uVar43 == 0x29) {
                  if (uVar40 < 2) break;
                  local_4e8 = *(ushort *)(binder_key._0_8_ + 4) << 8 |
                              *(ushort *)(binder_key._0_8_ + 4) >> 8;
                  binder_key._0_8_ = binder_key._0_8_ + 6;
                }
                else {
                  binder_key._0_8_ = end;
                  if (uVar43 != 0x28) goto LAB_0010e3b1;
                  binder_key._0_8_ = lVar53;
                  aVar42 = decode_key_share_entry
                                     ((uint16_t *)&max_early_data_size,&sh.peerkey,
                                      (uint8_t **)binder_key,end);
                  uVar24._4_1_ = finished_key[4];
                  uVar24._5_1_ = finished_key[5];
                  uVar24._6_1_ = finished_key[6];
                  uVar24._7_1_ = finished_key[7];
                  uVar24._0_1_ = finished_key[0];
                  uVar24._1_1_ = finished_key[1];
                  uVar24._2_1_ = finished_key[2];
                  uVar24._3_1_ = finished_key[3];
                  if ((aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) ||
                     (aVar42 = 0x32, (uint8_t *)binder_key._0_8_ != end))
                  goto switchD_0010db48_caseD_a;
                  lVar53 = binder_key._0_8_;
                  if (((tls->field_7).client.key_exchange.algo)->id != (uint16_t)max_early_data_size
                     ) goto LAB_0010f0f6;
                }
                lVar53 = binder_key._0_8_;
              } while ((uint8_t *)binder_key._0_8_ == end);
              goto LAB_0010dd0e;
            }
          }
        }
      }
      else {
LAB_0010e4f2:
        aVar42 = 0x28;
LAB_0010e4f4:
        uVar24._4_1_ = finished_key[4];
        uVar24._5_1_ = finished_key[5];
        uVar24._6_1_ = finished_key[6];
        uVar24._7_1_ = finished_key[7];
        uVar24._0_1_ = finished_key[0];
        uVar24._1_1_ = finished_key[1];
        uVar24._2_1_ = finished_key[2];
        uVar24._3_1_ = finished_key[3];
      }
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (uVar39 != '\b') goto LAB_0010e169;
    aVar42 = 0x32;
    uVar24 = uVar29;
    if ((sVar66 & 0xfffffffffffffffe) != 4) {
      uVar70 = (ulong)(ushort)(*(ushort *)(src + 4) << 8 | *(ushort *)(src + 4) >> 8);
      lVar53 = binder_key._0_8_;
      if (sVar66 - 6 < uVar70) {
LAB_0010dd0e:
        binder_key._0_8_ = lVar53;
        aVar42 = 0x32;
        goto LAB_0010e16b;
      }
      puVar69 = (ushort *)(src + 6);
      puVar44 = (ushort *)(src + uVar70 + 6);
      bVar68 = 0;
      do {
        do {
          while( true ) {
            if (puVar69 == puVar44) {
              aVar42 = 0x32;
              uVar24 = uVar30;
              if (puVar44 != (ushort *)(src + sVar66)) goto switchD_0010db48_caseD_a;
              psVar4 = tls->key_schedule->msghash;
              (*psVar4->update)(psVar4,src,sVar66);
              tls->state = (uint)(((tls->field_7).client.field_0x20 & 4) >> 2) * 2 +
                           PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
              goto LAB_0010e720;
            }
            if ((long)puVar44 - (long)puVar69 < 2) goto LAB_0010dd0e;
            uVar40 = *puVar69;
            uVar52 = uVar40 << 8 | uVar40 >> 8;
            if (uVar52 < 8) {
              if ((bVar68 >> (uVar52 & 0x1f) & 1) != 0) goto LAB_0010e6d6;
              bVar68 = (byte)(1 << ((byte)(uVar40 >> 8) & 0x1f)) & 7 | bVar68;
            }
            if (((ulong)((long)puVar44 - (long)(puVar69 + 1)) < 2) ||
               (uVar70 = (ulong)(ushort)(puVar69[1] << 8 | puVar69[1] >> 8),
               ((long)puVar44 - (long)puVar69) - 4U < uVar70)) goto LAB_0010dd0e;
            puVar69 = (ushort *)((long)puVar69 + uVar70 + 4);
            if (uVar52 != 0x2a) break;
            if (((tls->field_7).client.field_0x20 & 2) == 0) goto LAB_0010e6d6;
            if (properties != (ptls_handshake_properties_t *)0x0) {
              *(byte *)((long)properties + 0x18) = *(byte *)((long)properties + 0x18) | 1;
            }
          }
        } while (uVar52 != 0);
        if (uVar70 != 0) goto LAB_0010dd0e;
      } while (tls->server_name != (char *)0x0);
LAB_0010e6d6:
      aVar42 = 0x2f;
      uVar24 = uVar27;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (uVar39 != '\v') goto LAB_0010e169;
    aVar42 = 0x32;
    uVar24 = uVar26;
    if (sVar66 != 4) {
      uVar24 = uVar27;
      if ((ulong)src[4] <= sVar66 - 5) {
        if (src[4] == 0) {
          if (2 < sVar66 - 5) {
            lVar53 = 5;
            uVar70 = 0;
            do {
              uVar70 = (ulong)src[lVar53] | uVar70 << 8;
              lVar53 = lVar53 + 1;
            } while (lVar53 != 8);
            if (uVar70 <= sVar66 - 8) {
              puVar69 = (ushort *)(src + 8);
              puVar44 = (ushort *)(src + uVar70 + 8);
              local_4e0 = 0;
              do {
                if ((ulong)((long)puVar44 - (long)puVar69) < 3) goto switchD_0010db48_caseD_a;
                lVar53 = 0;
                uVar70 = 0;
                do {
                  uVar70 = (ulong)*(byte *)((long)puVar69 + lVar53) | uVar70 << 8;
                  lVar53 = lVar53 + 1;
                } while (lVar53 != 3);
                pcVar47 = (char *)((long)puVar69 + 3);
                if ((ulong)((long)puVar44 - (long)pcVar47) < uVar70) goto switchD_0010db48_caseD_a;
                if (local_4e0 < 0x10) {
                  *(char **)(sh.random + local_4e0 * 0x10) = pcVar47;
                  *(ulong *)(sh.random + local_4e0 * 0x10 + 8) = uVar70;
                  local_4e0 = local_4e0 + 1;
                }
                puVar69 = (ushort *)(pcVar47 + uVar70);
                if ((ulong)((long)puVar44 - (long)puVar69) < 2) goto switchD_0010db48_caseD_a;
                puVar67 = puVar69 + 1;
                uVar70 = (ulong)(ushort)(*puVar69 << 8 | *puVar69 >> 8);
                if ((ulong)((long)puVar44 - (long)puVar67) < uVar70) goto switchD_0010db48_caseD_a;
                puVar69 = (ushort *)(uVar70 + (long)puVar67);
                bVar68 = 0;
                for (; puVar67 != puVar69; puVar67 = (ushort *)((long)(puVar67 + 2) + uVar70)) {
                  if ((long)puVar69 - (long)puVar67 < 2) goto switchD_0010db48_caseD_a;
                  uVar40 = *puVar67;
                  uVar52 = uVar40 << 8 | uVar40 >> 8;
                  if (uVar52 < 8) {
                    if ((bVar68 >> (uVar52 & 0x1f) & 1) != 0) goto LAB_0010dd54;
                    bVar68 = (byte)(1 << ((byte)(uVar40 >> 8) & 0x1f)) & 7 | bVar68;
                  }
                  if ((ulong)((long)puVar69 - (long)(puVar67 + 1)) < 2)
                  goto switchD_0010db48_caseD_a;
                  uVar70 = (ulong)(ushort)(puVar67[1] << 8 | puVar67[1] >> 8);
                  if ((ulong)((long)puVar69 - (long)(puVar67 + 2)) < uVar70)
                  goto switchD_0010db48_caseD_a;
                }
              } while (puVar69 != puVar44);
              uVar24 = uVar28;
              if (puVar44 == (ushort *)(src + sVar66)) {
                psVar7 = tls->ctx->verify_certificate;
                if (psVar7 != (st_ptls_verify_certificate_t *)0x0) {
                  aVar42 = (*psVar7->cb)(psVar7,tls,&(tls->field_7).client.certificate_verify.cb,
                                         &(tls->field_7).client.certificate_verify.verify_ctx,
                                         (ptls_iovec_t *)&sh,local_4e0);
                  uVar24._4_1_ = finished_key[4];
                  uVar24._5_1_ = finished_key[5];
                  uVar24._6_1_ = finished_key[6];
                  uVar24._7_1_ = finished_key[7];
                  uVar24._0_1_ = finished_key[0];
                  uVar24._1_1_ = finished_key[1];
                  uVar24._2_1_ = finished_key[2];
                  uVar24._3_1_ = finished_key[3];
                  if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) break;
                }
                psVar4 = tls->key_schedule->msghash;
                (*psVar4->update)(psVar4,src,sVar66);
                tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
LAB_0010e720:
                uVar24._4_1_ = finished_key[4];
                uVar24._5_1_ = finished_key[5];
                uVar24._6_1_ = finished_key[6];
                uVar24._7_1_ = finished_key[7];
                uVar24._0_1_ = finished_key[0];
                uVar24._1_1_ = finished_key[1];
                uVar24._2_1_ = finished_key[2];
                uVar24._3_1_ = finished_key[3];
                aVar42 = 0x202;
              }
            }
          }
        }
        else {
LAB_0010dd54:
          aVar42 = 0x2f;
        }
      }
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (uVar39 != '\x0f') goto LAB_0010e169;
    aVar42 = 0x32;
    if ((5 < (long)sVar66) && ((sVar66 & 0x7ffffffffffffffe) != 6)) {
      uVar40 = *(ushort *)(src + 6) << 8 | *(ushort *)(src + 6) >> 8;
      if (((ulong)uVar40 <= sVar66 - 8) && (src + (ulong)uVar40 + 8 == src + sVar66)) {
        uVar52 = *(ushort *)(src + 4) << 8 | *(ushort *)(src + 4) >> 8;
        if ((uVar52 == 0x804) || (uVar52 == 0x403)) {
          sVar75 = build_certificate_verify_signdata(sh.random,tls->key_schedule,(char *)0x32);
          p_Var6 = (tls->field_7).client.certificate_verify.cb;
          if (p_Var6 == (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
            aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START;
          }
          else {
            pVar80.len = sVar75;
            pVar80.base = sh.random;
            pVar81.len._0_2_ = uVar40;
            pVar81.base = src + 8;
            pVar81.len._2_6_ = 0;
            aVar42 = (*p_Var6)((tls->field_7).client.certificate_verify.verify_ctx,pVar80,pVar81);
          }
          (*ptls_clear_memory)(&sh,sVar75);
          (tls->field_7).client.certificate_verify.cb =
               (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0;
          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
            psVar4 = tls->key_schedule->msghash;
            (*psVar4->update)(psVar4,src,sVar66);
            tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
            aVar42 = 0x202;
          }
        }
        else {
          aVar42 = 0x2f;
        }
      }
    }
    uVar24._4_1_ = finished_key[4];
    uVar24._5_1_ = finished_key[5];
    uVar24._6_1_ = finished_key[6];
    uVar24._7_1_ = finished_key[7];
    uVar24._0_1_ = finished_key[0];
    uVar24._1_1_ = finished_key[1];
    uVar24._2_1_ = finished_key[2];
    uVar24._3_1_ = finished_key[3];
    break;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (uVar39 != '\x14') goto LAB_0010e169;
    message_00.len = sVar66;
    message_00.base = src;
    aVar42 = verify_finished(tls,message_00);
    if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
      psVar4 = tls->key_schedule->msghash;
      (*psVar4->update)(psVar4,src,sVar66);
      aVar42 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      if (((aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) &&
          (aVar42 = setup_traffic_protection
                              (tls,tls->cipher_suite,0,"server application traffic secret"),
          aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START)) &&
         (aVar42 = derive_secret(tls->key_schedule,&sh,"client application traffic secret"),
         aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START)) {
        send_finished(tls,sendbuf);
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x30) = local_308;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x38) = uStack_300;
        *(uint8_t **)((tls->traffic_protection).enc.secret + 0x20) = sh.peerkey.base;
        *(size_t *)((tls->traffic_protection).enc.secret + 0x28) = sh.peerkey.len;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x10) = sh.random._16_8_;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x18) = sh.random._24_8_;
        *(undefined8 *)(tls->traffic_protection).enc.secret = sh.random._0_8_;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 8) = sh.random._8_8_;
        aVar42 = setup_traffic_protection(tls,tls->cipher_suite,1,(char *)0x0);
        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
          tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
          aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START;
        }
      }
    }
    (*ptls_clear_memory)(&sh,0x40);
    uVar24._4_1_ = finished_key[4];
    uVar24._5_1_ = finished_key[5];
    uVar24._6_1_ = finished_key[6];
    uVar24._7_1_ = finished_key[7];
    uVar24._0_1_ = finished_key[0];
    uVar24._1_1_ = finished_key[1];
    uVar24._2_1_ = finished_key[2];
    uVar24._3_1_ = finished_key[3];
    break;
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    if (uVar39 == '\x01') {
      certs = (ptls_iovec_t *)0x0;
      num_certs = 0;
      sign_algorithm = 0;
      signer = (_func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t *)0x0;
      signer_data = (void *)0x0;
      pubkey.base = (uint8_t *)0x0;
      pubkey.len = 0;
      ecdh_secret.base = (uint8_t *)0x0;
      ecdh_secret.len = 0;
      if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
        __assert_fail("tls->key_schedule == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                      ,0x69c,"int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
      }
      memset(&sh,0,0x128);
      uVar23._4_1_ = finished_key[4];
      uVar23._5_1_ = finished_key[5];
      uVar23._6_1_ = finished_key[6];
      uVar23._7_1_ = finished_key[7];
      uVar23._0_1_ = finished_key[0];
      uVar23._1_1_ = finished_key[1];
      uVar23._2_1_ = finished_key[2];
      uVar23._3_1_ = finished_key[3];
      uVar22._4_1_ = finished_key[4];
      uVar22._5_1_ = finished_key[5];
      uVar22._6_1_ = finished_key[6];
      uVar22._7_1_ = finished_key[7];
      uVar22._0_1_ = finished_key[0];
      uVar22._1_1_ = finished_key[1];
      uVar22._2_1_ = finished_key[2];
      uVar22._3_1_ = finished_key[3];
      aVar12 = 0x32;
      uVar35 = uVar23;
      aVar42 = aVar12;
      if ((((5 < (long)sVar66) &&
           (uVar35 = uVar22, aVar42 = 0x28,
           (ushort)(*(ushort *)(src + 4) << 8 | *(ushort *)(src + 4) >> 8) == 0x303)) &&
          (uVar35 = uVar23, aVar42 = aVar12, 0x26 < sVar66)) &&
         ((uVar70 = (ulong)src[0x26], uVar70 < 0x21 && (uVar70 <= sVar66 - 0x27)))) {
        puVar69 = (ushort *)(src + sVar66);
        if (1 < (ulong)((long)puVar69 - (long)(src + uVar70 + 0x27))) {
          uVar40 = *(ushort *)(src + uVar70 + 0x27);
          uVar54 = (ulong)(ushort)(uVar40 << 8 | uVar40 >> 8);
          puVar44 = (ushort *)(src + uVar70 + 0x29);
          if (uVar54 <= (ulong)((long)puVar69 - (long)puVar44)) {
            puVar67 = (ushort *)(uVar54 + (long)puVar44);
LAB_0010df6e:
            do {
              aVar42 = aVar12;
              if ((long)puVar67 - (long)puVar44 < 2) break;
              puVar55 = puVar44 + 1;
              if (tls->cipher_suite == (ptls_cipher_suite_t *)0x0) {
                pppVar64 = tls->ctx->cipher_suites;
                do {
                  ppVar5 = *pppVar64;
                  if (ppVar5 == (ptls_cipher_suite_t *)0x0) {
                    puVar44 = puVar55;
                    aVar42 = 0x28;
                    if (puVar55 != puVar67) goto LAB_0010df6e;
                    goto LAB_0010dfd2;
                  }
                  pppVar64 = pppVar64 + 1;
                } while (ppVar5->id != (uint16_t)(*puVar44 << 8 | *puVar44 >> 8));
                tls->cipher_suite = ppVar5;
              }
              puVar44 = puVar55;
              if (puVar55 == puVar67) {
                if (((puVar67 != puVar69) && (uVar70 = (ulong)(byte)*puVar67, uVar70 != 0)) &&
                   ((pbVar49 = (byte *)((long)puVar67 + 1),
                    uVar70 <= (ulong)((long)puVar69 - (long)pbVar49) &&
                    (pbVar59 = (byte *)((long)puVar67 + uVar70 + 1),
                    sh.random._8_8_ = (long)pbVar59 - (long)pbVar49, sh.random._0_8_ = pbVar49,
                    1 < (ulong)((long)puVar69 - (long)pbVar59))))) {
                  uVar40 = *(ushort *)((long)puVar67 + uVar70 + 1);
                  local_4d0 = (ushort *)(ulong)(ushort)(uVar40 << 8 | uVar40 >> 8);
                  puVar67 = (ushort *)((long)puVar67 + uVar70 + 3);
                  if (local_4d0 <= (ushort *)((long)puVar69 - (long)puVar67)) {
                    local_4d0 = (ushort *)((long)local_4d0 + (long)puVar67);
                    local_480 = 0;
                    aVar12 = 0x32;
                    local_4c0 = (ushort *)0x0;
                    local_458 = 0;
                    local_478 = 0;
                    puVar44 = _max_early_data_size;
                    finished_key._0_8_ = uVar23;
                    goto LAB_0010e8cb;
                  }
                }
                break;
              }
            } while( true );
          }
        }
      }
      goto LAB_0010dfd2;
    }
LAB_0010e00f:
    aVar42 = 0x28;
LAB_0010e16b:
    uVar24._4_1_ = finished_key[4];
    uVar24._5_1_ = finished_key[5];
    uVar24._6_1_ = finished_key[6];
    uVar24._7_1_ = finished_key[7];
    uVar24._0_1_ = finished_key[0];
    uVar24._1_1_ = finished_key[1];
    uVar24._2_1_ = finished_key[2];
    uVar24._3_1_ = finished_key[3];
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    if (uVar39 != '\x14') goto LAB_0010e00f;
    message.len = sVar66;
    message.base = src;
    aVar42 = verify_finished(tls,message);
    uVar24._4_1_ = finished_key[4];
    uVar24._5_1_ = finished_key[5];
    uVar24._6_1_ = finished_key[6];
    uVar24._7_1_ = finished_key[7];
    uVar24._0_1_ = finished_key[0];
    uVar24._1_1_ = finished_key[1];
    uVar24._2_1_ = finished_key[2];
    uVar24._3_1_ = finished_key[3];
    if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
      aVar42 = setup_traffic_protection(tls,tls->cipher_suite,0,"client application traffic secret")
      ;
      uVar24._4_1_ = finished_key[4];
      uVar24._5_1_ = finished_key[5];
      uVar24._6_1_ = finished_key[6];
      uVar24._7_1_ = finished_key[7];
      uVar24._0_1_ = finished_key[0];
      uVar24._1_1_ = finished_key[1];
      uVar24._2_1_ = finished_key[2];
      uVar24._3_1_ = finished_key[3];
      if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
        psVar4 = tls->key_schedule->msghash;
        (*psVar4->update)(psVar4,src,sVar66);
        uVar24._4_1_ = finished_key[4];
        uVar24._5_1_ = finished_key[5];
        uVar24._6_1_ = finished_key[6];
        uVar24._7_1_ = finished_key[7];
        uVar24._0_1_ = finished_key[0];
        uVar24._1_1_ = finished_key[1];
        uVar24._2_1_ = finished_key[2];
        uVar24._3_1_ = finished_key[3];
        if (tls->ctx->ticket_lifetime != 0) {
          paVar2 = &(tls->field_7).server;
          *(byte *)paVar2 = *(byte *)paVar2 | 1;
        }
        tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
        aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START;
      }
    }
    break;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (uVar39 != '\x04') goto LAB_0010e169;
    aVar42 = decode_new_session_ticket
                       ((uint32_t *)finished_key,(uint32_t *)binder_key,(ptls_iovec_t *)&sh,
                        &max_early_data_size,src + 4,src + sVar66);
    uVar25._4_1_ = finished_key[4];
    uVar25._5_1_ = finished_key[5];
    uVar25._6_1_ = finished_key[6];
    uVar25._7_1_ = finished_key[7];
    uVar25._0_1_ = finished_key[0];
    uVar25._1_1_ = finished_key[1];
    uVar25._2_1_ = finished_key[2];
    uVar25._3_1_ = finished_key[3];
    uVar24._4_1_ = finished_key[4];
    uVar24._5_1_ = finished_key[5];
    uVar24._6_1_ = finished_key[6];
    uVar24._7_1_ = finished_key[7];
    uVar24._0_1_ = finished_key[0];
    uVar24._1_1_ = finished_key[1];
    uVar24._2_1_ = finished_key[2];
    uVar24._3_1_ = finished_key[3];
    if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
      if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
        aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START;
        uVar24 = uVar25;
      }
      else {
        finished_key[0x10] = '\0';
        finished_key[0x11] = '\0';
        finished_key[0x12] = '\0';
        finished_key[0x13] = '\0';
        finished_key[0x14] = '\0';
        finished_key[0x15] = '\0';
        finished_key[0x16] = '\0';
        finished_key[0x17] = '\0';
        finished_key[8] = '\0';
        finished_key[9] = '\x02';
        finished_key[10] = '\0';
        finished_key[0xb] = '\0';
        finished_key[0xc] = '\0';
        finished_key[0xd] = '\0';
        finished_key[0xe] = '\0';
        finished_key[0xf] = '\0';
        finished_key._24_8_ = finished_key._24_8_ & 0xffffffff00000000;
        finished_key._0_8_ = &sh;
        uVar45 = gettime_millis();
        binder_key._0_8_ =
             uVar45 >> 0x38 | (uVar45 & 0xff000000000000) >> 0x28 |
             (uVar45 & 0xff0000000000) >> 0x18 | (uVar45 & 0xff00000000) >> 8 |
             (uVar45 & 0xff000000) << 8 | (uVar45 & 0xff0000) << 0x18 | (uVar45 & 0xff00) << 0x28 |
             uVar45 << 0x38;
        aVar42 = ptls_buffer__do_pushv((ptls_buffer_t *)finished_key,binder_key,8);
        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
          uVar40 = tls->cipher_suite->id;
          _max_early_data_size =
               (ushort *)CONCAT62(stack0xfffffffffffffc3a,uVar40 << 8 | uVar40 >> 8);
          aVar42 = ptls_buffer__do_pushv((ptls_buffer_t *)finished_key,&max_early_data_size,2);
          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
            aVar42 = ptls_buffer__do_pushv((ptls_buffer_t *)finished_key,"",3);
            uVar13 = finished_key._16_8_;
            if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
              aVar42 = ptls_buffer__do_pushv((ptls_buffer_t *)finished_key,src + 4,sVar66 - 4);
              if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                puVar57 = (undefined1 *)(finished_key._0_8_ + uVar13 + -3);
                for (lVar53 = 0x10; lVar53 != -8; lVar53 = lVar53 + -8) {
                  *puVar57 = (char)((ulong)(finished_key._16_8_ - uVar13) >> ((byte)lVar53 & 0x3f));
                  puVar57 = puVar57 + 1;
                }
                aVar42 = ptls_buffer__do_pushv((ptls_buffer_t *)finished_key,"",2);
                uVar13 = finished_key._16_8_;
                if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                  aVar42 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,
                                               tls->key_schedule->algo->digest_size);
                  uVar15 = finished_key._16_8_;
                  uVar14 = finished_key._0_8_;
                  if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                    aVar42 = derive_resumption_secret
                                       (tls->key_schedule,
                                        (uint8_t *)(finished_key._16_8_ + finished_key._0_8_));
                    if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                      finished_key._16_8_ = uVar15 + tls->key_schedule->algo->digest_size;
                      *(char *)(uVar14 + -2 + uVar13) =
                           (char)((ulong)(finished_key._16_8_ - uVar13) >> 8);
                      *(char *)(uVar14 + -1 + uVar13) = (char)(finished_key._16_8_ - uVar13);
                      psVar9 = tls->ctx->save_ticket;
                      pVar78.len = finished_key._16_8_;
                      pVar78.base = (uint8_t *)uVar14;
                      aVar42 = (*psVar9->cb)(psVar9,tls,pVar78);
                    }
                  }
                }
              }
            }
          }
        }
        ptls_buffer_dispose((ptls_buffer_t *)finished_key);
        uVar24 = finished_key._0_8_;
      }
    }
  }
switchD_0010db48_caseD_a:
  finished_key._0_8_ = uVar24;
  ptls_buffer_dispose(buf_00);
  uVar14 = finished_key._0_8_;
LAB_0010e17a:
  finished_key._0_8_ = uVar14;
  ptls_buffer_dispose(&buf->rec);
  return aVar42;
LAB_0010e8cb:
  _max_early_data_size = puVar44;
  local_4f0 = puVar67;
  uVar35 = finished_key._0_8_;
  if (local_4f0 == local_4d0) {
    aVar42 = aVar12;
    if (local_4d0 != puVar69) goto LAB_0010dfd2;
    if (sh.random._16_2_ != 0x7f12) {
      aVar42 = 0x46;
      goto LAB_0010dfd2;
    }
    if ((sh.random._8_8_ != 1) || (*(char *)sh.random._0_8_ != '\0')) {
LAB_0010f253:
      uVar35 = finished_key._0_8_;
      aVar42 = 0x2f;
      goto LAB_0010dfd2;
    }
    aVar42 = 0x6d;
    if ((sh.random._24_8_ == 0) ||
       ((local_2f8 == 0 || (local_2f0 == (ptls_key_exchange_algorithm_t *)0x0)))) goto LAB_0010dfd2;
    if (local_4c0 == (ushort *)0x0) {
      bVar76 = local_214 == 0 && local_218 == 0;
    }
    else {
      bVar76 = (short)local_458 == 0x29;
    }
    aVar42 = 0x2f;
    if (!bVar76) goto LAB_0010dfd2;
    goto LAB_0010f32e;
  }
  aVar42 = 0x32;
  if ((long)local_4d0 - (long)local_4f0 < 2) goto LAB_0010dfd2;
  uVar40 = *local_4f0;
  uVar52 = uVar40 << 8 | uVar40 >> 8;
  local_458 = (ulong)uVar52;
  if (uVar52 < 8) {
    if (((byte)local_478 >> (uVar52 & 0x1f) & 1) != 0) goto LAB_0010f253;
    uVar70 = (ulong)(uint)(1 << ((byte)(uVar40 >> 8) & 0x1f)) & 0xffffffffffffff07;
    local_478 = CONCAT71((int7)(uVar70 >> 8),(byte)uVar70 | (byte)local_478);
  }
  aVar42 = aVar12;
  if ((ulong)((long)local_4d0 - (long)(local_4f0 + 1)) < 2) goto LAB_0010dfd2;
  uVar70 = (ulong)(ushort)(local_4f0[1] << 8 | local_4f0[1] >> 8);
  _max_early_data_size = local_4f0 + 2;
  if ((ulong)((long)local_4d0 - (long)_max_early_data_size) < uVar70) goto LAB_0010dfd2;
  local_460 = (byte *)((long)local_4f0 + 3);
  puVar67 = (ushort *)(local_460 + uVar70 + 1);
  puVar44 = puVar67;
  switch(uVar52) {
  case 0x28:
    if ((ulong)((long)puVar67 - (long)_max_early_data_size) < 2) goto LAB_0010dfd2;
    local_488 = tls->ctx->key_exchanges;
    uVar70 = (ulong)(ushort)(local_4f0[2] << 8 | local_4f0[2] >> 8);
    binder_key._0_8_ = local_4f0 + 3;
    if ((ulong)((long)puVar67 - binder_key._0_8_) < uVar70) goto LAB_0010dfd2;
    puVar55 = (ushort *)(uVar70 + binder_key._0_8_);
    ppVar60 = local_2f0;
LAB_0010e9f9:
    if ((ushort *)binder_key._0_8_ != puVar55) {
      aVar42 = decode_key_share_entry
                         (&group,(ptls_iovec_t *)finished_key,(uint8_t **)binder_key,
                          (uint8_t *)puVar55);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      if (ppVar60 == (ptls_key_exchange_algorithm_t *)0x0) {
        pppVar61 = local_488;
        do {
          ppVar60 = *pppVar61;
          if (ppVar60 == (ptls_key_exchange_algorithm_t *)0x0) {
            ppVar60 = (ptls_key_exchange_algorithm_t *)0x0;
            goto LAB_0010e9f9;
          }
          pppVar61 = pppVar61 + 1;
        } while (ppVar60->id != group);
        auStack_2e0[0] = finished_key[8];
        auStack_2e0[1] = finished_key[9];
        auStack_2e0[2] = finished_key[10];
        auStack_2e0[3] = finished_key[0xb];
        auStack_2dc[0] = finished_key[0xc];
        auStack_2dc[1] = finished_key[0xd];
        auStack_2dc[2] = finished_key[0xe];
        auStack_2dc[3] = finished_key[0xf];
        local_2f0 = ppVar60;
        uVar13 = finished_key._0_8_;
      }
      goto LAB_0010e9f9;
    }
    break;
  case 0x29:
    if ((ulong)((long)puVar67 - (long)_max_early_data_size) < 2) goto LAB_0010dfd2;
    local_4c0 = (ushort *)(ulong)(ushort)(local_4f0[2] << 8 | local_4f0[2] >> 8);
    _max_early_data_size = local_4f0 + 3;
    if ((ushort *)((long)puVar67 - (long)_max_early_data_size) < local_4c0) goto LAB_0010dfd2;
    local_4c0 = (ushort *)((long)local_4c0 + (long)_max_early_data_size);
    lVar53 = 1;
    do {
      lVar56 = lVar53;
      finished_key[0x10] = '\0';
      finished_key[0x11] = '\0';
      finished_key[0x12] = '\0';
      finished_key[0x13] = '\0';
      finished_key[0x14] = '\0';
      finished_key[0x15] = '\0';
      finished_key[0x16] = '\0';
      finished_key[0x17] = '\0';
      finished_key[0x18] = '\0';
      finished_key[0x19] = '\0';
      finished_key[0x1a] = '\0';
      finished_key[0x1b] = '\0';
      finished_key[0x1c] = '\0';
      finished_key[0x1d] = '\0';
      finished_key[0x1e] = '\0';
      finished_key[0x1f] = '\0';
      finished_key[0x20] = '\0';
      finished_key[0x21] = '\0';
      finished_key[0x22] = '\0';
      finished_key[0x23] = '\0';
      finished_key[0x24] = '\0';
      finished_key[0x25] = '\0';
      finished_key[0x26] = '\0';
      finished_key[0x27] = '\0';
      uVar34._0_1_ = '\0';
      uVar34._1_1_ = '\0';
      uVar34._2_1_ = '\0';
      uVar34._3_1_ = '\0';
      uVar34._4_1_ = '\0';
      uVar34._5_1_ = '\0';
      uVar34._6_1_ = '\0';
      uVar34._7_1_ = '\0';
      uVar35._0_1_ = '\0';
      uVar35._1_1_ = '\0';
      uVar35._2_1_ = '\0';
      uVar35._3_1_ = '\0';
      uVar35._4_1_ = '\0';
      uVar35._5_1_ = '\0';
      uVar35._6_1_ = '\0';
      uVar35._7_1_ = '\0';
      finished_key[8] = '\0';
      finished_key[9] = '\0';
      finished_key[10] = '\0';
      finished_key[0xb] = '\0';
      finished_key[0xc] = '\0';
      finished_key[0xd] = '\0';
      finished_key[0xe] = '\0';
      finished_key[0xf] = '\0';
      aVar42 = aVar12;
      if ((ulong)((long)local_4c0 - (long)_max_early_data_size) < 2) goto LAB_0010dfd2;
      uVar40 = *_max_early_data_size << 8 | *_max_early_data_size >> 8;
      finished_key._0_8_ = _max_early_data_size + 1;
      uVar35 = uVar34;
      if ((ulong)((long)local_4c0 - finished_key._0_8_) < (ulong)uVar40) goto LAB_0010dfd2;
      _max_early_data_size = (ushort *)(finished_key._0_8_ + (ulong)uVar40);
      finished_key[10] = '\0';
      finished_key[0xb] = '\0';
      finished_key[8] = (char)uVar40;
      finished_key[9] = (char)(uVar40 >> 8);
      finished_key[0xc] = '\0';
      finished_key[0xd] = '\0';
      finished_key[0xe] = '\0';
      finished_key[0xf] = '\0';
      aVar42 = decode32((uint32_t *)(finished_key + 0x10),(uint8_t **)&max_early_data_size,
                        (uint8_t *)local_4c0);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      if (local_220 < 4) {
        *(undefined8 *)(local_2a8 + (local_220 * 5 + 1) * 8) = finished_key._32_8_;
        *(undefined8 *)(auStack_2b0 + local_220 * 0x28) = finished_key._16_8_;
        *(undefined8 *)(local_2a8 + local_220 * 0x28) = finished_key._24_8_;
        *(undefined4 *)(local_2c0 + local_220 * 0x28) = finished_key._0_4_;
        *(undefined4 *)(auStack_2bc + local_220 * 0x28) = finished_key._4_4_;
        *(undefined4 *)(local_2b8 + local_220 * 0x28) = finished_key._8_4_;
        *(undefined4 *)(auStack_2b4 + local_220 * 0x28) = finished_key._12_4_;
        local_220 = local_220 + 1;
      }
      uVar70 = local_220;
      lVar53 = lVar56 + 1;
    } while (_max_early_data_size != local_4c0);
    aVar42 = aVar12;
    if ((ulong)((long)puVar67 - (long)local_4c0) < 2) goto LAB_0010dfd2;
    uVar54 = (ulong)(ushort)(*_max_early_data_size << 8 | *_max_early_data_size >> 8);
    puVar48 = _max_early_data_size + 1;
    if ((ulong)((long)puVar67 - (long)puVar48) < uVar54) goto LAB_0010dfd2;
    puVar55 = (ushort *)(uVar54 + (long)puVar48);
    local_480 = local_220;
    puVar58 = (ulong *)(local_2a8 + 8);
    uVar54 = 0;
    do {
      uVar35 = finished_key._0_8_;
      if (puVar55 == puVar48) goto LAB_0010dfd2;
      uVar65 = (ulong)(byte)*puVar48;
      pbVar49 = (byte *)((long)puVar48 + 1);
      if ((ulong)((long)puVar55 - (long)pbVar49) < uVar65) goto LAB_0010dfd2;
      if (uVar54 < uVar70) {
        puVar58[-1] = (ulong)pbVar49;
        *puVar58 = uVar65;
      }
      puVar48 = (ushort *)(pbVar49 + uVar65);
      uVar54 = uVar54 + 1;
      lVar56 = lVar56 + -1;
      puVar58 = puVar58 + 5;
    } while (puVar48 != puVar55);
    local_2c8 = _max_early_data_size;
    if (lVar56 != 0) goto LAB_0010f253;
    break;
  case 0x2a:
    local_214 = 1;
    goto LAB_0010e8cb;
  case 0x2b:
    if (uVar70 == 0) goto LAB_0010dfd2;
    _max_early_data_size = (ushort *)((long)local_4f0 + 5);
    uVar70 = (ulong)(byte)local_4f0[2];
    if ((ulong)((long)puVar67 - (long)_max_early_data_size) < uVar70) goto LAB_0010dfd2;
    puVar55 = (ushort *)((long)_max_early_data_size + uVar70);
    puVar48 = _max_early_data_size;
    sVar63 = sh.random._16_2_;
    do {
      if ((long)uVar70 < 2) goto LAB_0010dfd2;
      if ((sVar63 == 0) && ((ushort)(*puVar48 << 8 | *puVar48 >> 8) == 0x7f12)) {
        sh.random[0x10] = '\x12';
        sh.random[0x11] = '\x7f';
        sVar63 = 0x7f12;
      }
      uVar70 = uVar70 - 2;
      puVar48 = puVar48 + 1;
    } while (puVar48 != puVar55);
    break;
  case 0x2c:
    if (uVar70 != 0) goto LAB_0010f253;
    goto LAB_0010e8cb;
  case 0x2d:
    if (uVar70 == 0) goto LAB_0010dfd2;
    uVar43 = local_218;
    for (uVar54 = 0; uVar70 != uVar54; uVar54 = uVar54 + 1) {
      if (*(byte *)((long)_max_early_data_size + uVar54) < 0x20) {
        uVar43 = uVar43 | 1 << (*(byte *)((long)_max_early_data_size + uVar54) & 0x1f);
        local_218 = uVar43;
      }
    }
    goto LAB_0010e8cb;
  default:
    if (uVar52 == 0xd) {
      if (1 < (ulong)((long)puVar67 - (long)_max_early_data_size)) {
        uVar70 = (ulong)(ushort)(local_4f0[2] << 8 | local_4f0[2] >> 8);
        _max_early_data_size = local_4f0 + 3;
        if (uVar70 <= (ulong)((long)puVar67 - (long)_max_early_data_size)) {
          puVar55 = (ushort *)((long)_max_early_data_size + uVar70);
          pbVar49 = (byte *)((long)local_4f0 + 7);
          sVar75 = local_2f8;
          do {
            if ((long)uVar70 < 2) goto LAB_0010dfd2;
            uVar54 = sVar75;
            if (sVar75 < 0x10) {
              uVar54 = sVar75 + 1;
              *(ushort *)(sh.random + sVar75 * 2 + 0x20) =
                   *(ushort *)(pbVar49 + -1) << 8 | *(ushort *)(pbVar49 + -1) >> 8;
              local_2f8 = uVar54;
            }
            pbVar49 = pbVar49 + 2;
            uVar70 = uVar70 - 2;
            sVar75 = uVar54;
          } while (uVar70 != 0);
          break;
        }
      }
      goto LAB_0010dfd2;
    }
    if (uVar52 == 10) {
      if (1 < (ulong)((long)puVar67 - (long)_max_early_data_size)) {
        uVar70 = (ulong)(ushort)(local_4f0[2] << 8 | local_4f0[2] >> 8);
        local_4f0 = local_4f0 + 3;
        if (uVar70 <= (ulong)((long)puVar67 - (long)local_4f0)) goto code_r0x0010ef53;
      }
      goto LAB_0010dfd2;
    }
    if (uVar52 == 0) {
      if ((ulong)((long)puVar67 - (long)_max_early_data_size) < 2) goto LAB_0010dfd2;
      uVar54 = (ulong)(ushort)(local_4f0[2] << 8 | local_4f0[2] >> 8);
      pppVar61 = (ptls_key_exchange_algorithm_t **)(local_4f0 + 3);
      if (((ulong)((long)puVar67 - (long)pppVar61) < uVar54) || (uVar54 == 0)) goto LAB_0010dfd2;
      local_460 = local_460 + uVar70;
      local_488 = (ptls_key_exchange_algorithm_t **)((long)local_4f0 + uVar54 + 6);
      do {
        uVar35 = finished_key._0_8_;
        if ((byte *)(~(ulong)pppVar61 + (long)local_488) < (byte *)0x2) goto LAB_0010dfd2;
        uVar70 = (ulong)(ushort)(*(ushort *)((long)pppVar61 + 1) << 8 |
                                *(ushort *)((long)pppVar61 + 1) >> 8);
        pbVar49 = (byte *)((long)pppVar61 + 3);
        if ((ulong)((long)local_488 - (long)pbVar49) < uVar70) goto LAB_0010dfd2;
        if (*(byte *)pppVar61 == 0) {
          pvVar46 = memchr(pbVar49,0,uVar70);
          if ((pvVar46 != (void *)0x0) || (tls->server_name != (char *)0x0)) goto LAB_0010f253;
          pcVar47 = (char *)malloc(uVar70 + 1);
          tls->server_name = pcVar47;
          if (pcVar47 == (char *)0x0) {
            uVar35 = finished_key._0_8_;
            aVar42 = 0x201;
            goto LAB_0010dfd2;
          }
          memcpy(pcVar47,pbVar49,uVar70);
          pcVar47[uVar70] = '\0';
        }
        pppVar61 = (ptls_key_exchange_algorithm_t **)(pbVar49 + uVar70);
      } while (pppVar61 != local_488);
      uVar35 = finished_key._0_8_;
      if ((byte *)((long)local_4f0 + uVar54 + 5) != local_460) goto LAB_0010dfd2;
    }
    goto LAB_0010e8cb;
  }
  uVar35 = finished_key._0_8_;
  aVar42 = aVar12;
  if (puVar55 != puVar67) goto LAB_0010dfd2;
  goto LAB_0010e8cb;
code_r0x0010ef53:
  puVar55 = (ushort *)(uVar70 + (long)local_4f0);
  ppVar60 = (ptls_key_exchange_algorithm_t *)sh.random._24_8_;
  do {
    if ((long)puVar55 - (long)local_4f0 < 2) goto LAB_0010dfd2;
    ppVar38 = (ptls_key_exchange_algorithm_t *)sh.random._24_8_;
    if (ppVar60 == (ptls_key_exchange_algorithm_t *)0x0) {
      pppVar61 = tls->ctx->key_exchanges;
      do {
        ppVar60 = *pppVar61;
        if (ppVar60 == (ptls_key_exchange_algorithm_t *)0x0) {
          bVar76 = true;
          ppVar60 = (ptls_key_exchange_algorithm_t *)0x0;
          bVar21 = false;
          aVar37 = 0x28;
          goto LAB_0010efab;
        }
        pppVar61 = pppVar61 + 1;
        ppVar38 = ppVar60;
      } while (ppVar60->id != (uint16_t)(*local_4f0 << 8 | *local_4f0 >> 8));
    }
    sh.random._24_8_ = ppVar38;
    bVar76 = false;
    bVar21 = true;
    aVar37 = PTLS_STATE_CLIENT_HANDSHAKE_START;
LAB_0010efab:
    local_4f0 = local_4f0 + 1;
  } while (local_4f0 != puVar55);
  if (puVar55 != puVar67 || bVar76) goto LAB_0010f28a;
  goto LAB_0010e8cb;
LAB_0010f28a:
  aVar42 = 0x32;
  if ((puVar55 == puVar67) && (aVar42 = aVar37, bVar21)) {
LAB_0010f32e:
    psVar50 = key_schedule_new(tls->cipher_suite->hash);
    tls->key_schedule = psVar50;
    if (tls->ctx->require_dhe_on_psk != 0) {
      local_218 = local_218 & 0xfffffffe;
    }
    if (((local_4c0 == (ushort *)0x0) || ((local_218 & 3) == 0)) ||
       (tls->ctx->decrypt_ticket == (ptls_encrypt_ticket_t *)0x0)) {
      (*psVar50->msghash->update)(psVar50->msghash,src,sVar66);
LAB_0010f56b:
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      uVar70 = 0xffffffffffffffff;
      bVar21 = true;
      bVar76 = true;
    }
    else {
      (*psVar50->msghash->update)(psVar50->msghash,src,(long)local_4c0 - (long)src);
      _group = finished_key;
      local_3d8 = 0;
      local_3e0 = 0x100;
      local_3d0 = 0;
      psVar72 = (size_t *)(local_2a8 + 8);
      aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START;
      for (uVar70 = 0; uVar70 < local_480; uVar70 = uVar70 + 1) {
        local_3d8 = 0;
        psVar10 = tls->ctx->decrypt_ticket;
        iVar41 = (*psVar10->cb)(psVar10,tls,(ptls_buffer_t *)&group,*(ptls_iovec_t *)(psVar72 + -4))
        ;
        if (iVar41 == 0) {
          iVar41 = decode_session_identifier
                             (&issue_at,&ticket_psk,&age_add,&ticket_server_name,&ticket_csid,_group
                              ,_group + local_3d8);
          sVar66 = ticket_server_name.len;
          if (iVar41 == 0) {
            pcVar47 = tls->server_name;
            if (ticket_server_name.len == 0) {
              if (pcVar47 == (char *)0x0) {
LAB_0010f49a:
                if ((ticket_csid == tls->cipher_suite->id) &&
                   ((ticket_psk.len == tls->key_schedule->algo->digest_size &&
                    (*psVar72 == ticket_psk.len)))) {
                  ikm_01.base._2_1_ = ticket_psk.base._2_1_;
                  ikm_01.base._0_2_ = (ushort)ticket_psk.base;
                  ikm_01.base._3_5_ = ticket_psk.base._3_5_;
                  ikm_01.len = ticket_psk.len;
                  aVar42 = key_schedule_extract(tls->key_schedule,ikm_01);
                  if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                    aVar42 = derive_secret(tls->key_schedule,binder_key,"resumption psk binder key")
                    ;
                    if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                      aVar42 = calc_verify_data(&max_early_data_size,tls->key_schedule,binder_key);
                      if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                        iVar41 = bcmp((void *)psVar72[-1],&max_early_data_size,
                                      tls->key_schedule->algo->digest_size);
                        aVar42 = 0x33;
                        if (iVar41 == 0) {
                          aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START;
                        }
                      }
                    }
                  }
                  goto LAB_0010fbb6;
                }
              }
            }
            else if (pcVar47 != (char *)0x0) {
              iVar41 = strncmp(pcVar47,(char *)CONCAT62(ticket_server_name.base._2_6_,
                                                        ticket_server_name.base._0_2_),
                               ticket_server_name.len);
              if ((iVar41 == 0) && (pcVar47[sVar66] == '\0')) goto LAB_0010f49a;
            }
          }
        }
        local_480 = local_220;
        psVar72 = psVar72 + 5;
      }
      uVar70 = 0xffffffffffffffff;
LAB_0010fbb6:
      ptls_buffer_dispose((ptls_buffer_t *)&group);
      (*ptls_clear_memory)(binder_key,0x40);
      (*ptls_clear_memory)(&max_early_data_size,0x40);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      psVar4 = tls->key_schedule->msghash;
      (*psVar4->update)(psVar4,local_2c8,(long)puVar69 - (long)local_2c8);
      if (uVar70 == 0xffffffffffffffff) goto LAB_0010f56b;
      if ((local_218 & 1) == 0) {
        if ((local_218 & 2) == 0) {
          __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                        ,0x6b9,"int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
        }
        bVar76 = true;
        bVar21 = false;
      }
      else {
        bVar21 = false;
        bVar76 = false;
      }
    }
    if (((local_214 == 0) || (uVar70 != 0)) || (tls->ctx->max_early_data_size == 0)) {
LAB_0010f5d6:
      if ((bool)(local_2f0 == &key_exchange_no_match & bVar76)) {
        if (sh.random._24_8_ == 0) {
          uVar35 = finished_key._0_8_;
          aVar42 = 0x28;
        }
        else {
          binder_key[0] = '\x16';
          binder_key[1] = '\x03';
          binder_key[2] = '\x01';
          aVar42 = ptls_buffer__do_pushv(sendbuf,binder_key,3);
          uVar35 = finished_key._0_8_;
          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
            aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
            uVar35 = finished_key._0_8_;
            if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
              sVar66 = sendbuf->off;
              issue_at._0_2_ = CONCAT11(issue_at._1_1_,6);
              aVar42 = ptls_buffer__do_pushv(sendbuf,&issue_at,1);
              uVar35 = finished_key._0_8_;
              if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                aVar42 = ptls_buffer__do_pushv(sendbuf,"",3);
                uVar35 = finished_key._0_8_;
                if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                  sVar75 = sendbuf->off;
                  _max_early_data_size = (ushort *)CONCAT62(stack0xfffffffffffffc3a,0x127f);
                  aVar42 = ptls_buffer__do_pushv(sendbuf,&max_early_data_size,2);
                  uVar35 = finished_key._0_8_;
                  if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                    aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
                    uVar35 = finished_key._0_8_;
                    if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                      sVar73 = sendbuf->off;
                      _group = (uint8_t *)CONCAT62(uStack_3e6,0x2800);
                      aVar42 = ptls_buffer__do_pushv(sendbuf,&group,2);
                      uVar35 = finished_key._0_8_;
                      if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                        aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
                        uVar35 = finished_key._0_8_;
                        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                          sVar74 = sendbuf->off;
                          ticket_psk.base._0_2_ =
                               *(ushort *)sh.random._24_8_ << 8 | *(ushort *)sh.random._24_8_ >> 8;
                          aVar42 = ptls_buffer__do_pushv(sendbuf,&ticket_psk,2);
                          uVar35 = finished_key._0_8_;
                          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                            lVar53 = sendbuf->off - sVar74;
                            sendbuf->base[sVar74 - 2] = (uint8_t)((ulong)lVar53 >> 8);
                            sendbuf->base[sVar74 - 1] = (uint8_t)lVar53;
                            ticket_server_name.base._0_2_ = 0xd00;
                            aVar42 = ptls_buffer__do_pushv(sendbuf,&ticket_server_name,2);
                            uVar35 = finished_key._0_8_;
                            if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                              aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
                              uVar35 = finished_key._0_8_;
                              if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                                sVar74 = sendbuf->off;
                                for (lVar53 = -2; lVar53 != 0; lVar53 = lVar53 + 1) {
                                  sendbuf->base[lVar53 + sVar74] = '\0';
                                }
                                lVar53 = sendbuf->off - sVar73;
                                sendbuf->base[sVar73 - 2] = (uint8_t)((ulong)lVar53 >> 8);
                                sendbuf->base[sVar73 - 1] = (uint8_t)lVar53;
                                uVar70 = sendbuf->off - sVar75;
                                for (lVar53 = 0x10; lVar53 != -8; lVar53 = lVar53 + -8) {
                                  sendbuf->base[sVar75 - 3] =
                                       (uint8_t)(uVar70 >> ((byte)lVar53 & 0x3f));
                                  sVar75 = sVar75 + 1;
                                }
                                lVar53 = sendbuf->off - sVar66;
                                sendbuf->base[sVar66 - 2] = (uint8_t)((ulong)lVar53 >> 8);
                                sendbuf->base[sVar66 - 1] = (uint8_t)lVar53;
                                aVar42 = 0x202;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_0010dfd2;
      }
      if (bVar21) {
        psVar11 = tls->ctx->lookup_certificate;
        aVar42 = (*psVar11->cb)(psVar11,tls,&sign_algorithm,&signer,&signer_data,&certs,&num_certs,
                                tls->server_name,(uint16_t *)&sh.peerkey,local_2f8);
        uVar35 = finished_key._0_8_;
        if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
        if (sign_algorithm == 0) {
          __assert_fail("sign_algorithm != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                        ,0x6e4,"int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
        }
      }
      if (bVar76) {
        pVar20.len._0_1_ = auStack_2e0[0];
        pVar20.len._1_1_ = auStack_2e0[1];
        pVar20.len._2_1_ = auStack_2e0[2];
        pVar20.len._3_1_ = auStack_2e0[3];
        pVar20.base = (uint8_t *)uVar13;
        pVar20.len._4_1_ = auStack_2dc[0];
        pVar20.len._5_1_ = auStack_2dc[1];
        pVar20.len._6_1_ = auStack_2dc[2];
        pVar20.len._7_1_ = auStack_2dc[3];
        aVar42 = (*local_2f0->exchange)(&pubkey,&ecdh_secret,pVar20);
        uVar35 = finished_key._0_8_;
        if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      }
      binder_key[0] = '\x16';
      binder_key[1] = '\x03';
      binder_key[2] = '\x01';
      aVar42 = ptls_buffer__do_pushv(sendbuf,binder_key,3);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      sVar66 = sendbuf->off;
      local_4a9 = 2;
      aVar42 = ptls_buffer__do_pushv(sendbuf,&local_4a9,1);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      aVar42 = ptls_buffer__do_pushv(sendbuf,"",3);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      local_4f8 = sendbuf->off;
      ticket_server_name.base._0_2_ = 0x127f;
      aVar42 = ptls_buffer__do_pushv(sendbuf,&ticket_server_name,2);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      aVar42 = ptls_buffer_reserve(sendbuf,0x20);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      local_4b8 = sendbuf;
      (*tls->ctx->random_bytes)(sendbuf->base + sendbuf->off,0x20);
      local_4b8->off = local_4b8->off + 0x20;
      uVar40 = tls->cipher_suite->id;
      issue_at._0_2_ = uVar40 << 8 | uVar40 >> 8;
      aVar42 = ptls_buffer__do_pushv(local_4b8,&issue_at,2);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      sVar75 = sendbuf->off;
      if (bVar76) {
        age_add._0_2_ = 0x2800;
        aVar42 = ptls_buffer__do_pushv(sendbuf,&age_add,2);
        uVar35 = finished_key._0_8_;
        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
          aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
          uVar35 = finished_key._0_8_;
          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
            local_4d0 = (ushort *)sendbuf->off;
            ticket_csid = local_2f0->id << 8 | local_2f0->id >> 8;
            aVar42 = ptls_buffer__do_pushv(sendbuf,&ticket_csid,2);
            uVar35 = finished_key._0_8_;
            if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
              aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
              uVar35 = finished_key._0_8_;
              if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                sVar73 = sendbuf->off;
                aVar42 = ptls_buffer__do_pushv(sendbuf,pubkey.base,pubkey.len);
                uVar35 = finished_key._0_8_;
                if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                  lVar53 = sendbuf->off - sVar73;
                  sendbuf->base[sVar73 - 2] = (uint8_t)((ulong)lVar53 >> 8);
                  sendbuf->base[sVar73 - 1] = (uint8_t)lVar53;
                  lVar53 = sendbuf->off - (long)local_4d0;
                  (sendbuf->base + -2)[(long)local_4d0] = (uint8_t)((ulong)lVar53 >> 8);
                  (sendbuf->base + -1)[(long)local_4d0] = (uint8_t)lVar53;
                  goto LAB_0010fac7;
                }
              }
            }
          }
        }
        goto LAB_0010dfd2;
      }
LAB_0010fac7:
      if (!bVar21) {
        local_462 = 0x2900;
        aVar42 = ptls_buffer__do_pushv(sendbuf,&local_462,2);
        uVar35 = finished_key._0_8_;
        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
          aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
          uVar35 = finished_key._0_8_;
          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
            sVar73 = sendbuf->off;
            local_464 = (ushort)uVar70 << 8 | (ushort)uVar70 >> 8;
            aVar42 = ptls_buffer__do_pushv(sendbuf,&local_464,2);
            uVar35 = finished_key._0_8_;
            if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
              lVar53 = sendbuf->off - sVar73;
              sendbuf->base[sVar73 - 2] = (uint8_t)((ulong)lVar53 >> 8);
              sendbuf->base[sVar73 - 1] = (uint8_t)lVar53;
              goto LAB_0010fb5b;
            }
          }
        }
        goto LAB_0010dfd2;
      }
LAB_0010fb5b:
      lVar53 = -2;
      lVar56 = sendbuf->off - sVar75;
      sendbuf->base[sVar75 - 2] = (uint8_t)((ulong)lVar56 >> 8);
      sendbuf->base[sVar75 - 1] = (uint8_t)lVar56;
      uVar70 = sendbuf->off - local_4f8;
      for (lVar56 = 0x10; lVar56 != -8; lVar56 = lVar56 + -8) {
        sendbuf->base[local_4f8 - 3] = (uint8_t)(uVar70 >> ((byte)lVar56 & 0x3f));
        local_4f8 = local_4f8 + 1;
      }
      sVar75 = sendbuf->off;
      if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
        psVar4 = tls->key_schedule->msghash;
        (*psVar4->update)(psVar4,sendbuf->base + sVar66,sVar75 - sVar66);
        sVar75 = sendbuf->off;
      }
      sendbuf->base[sVar66 - 2] = (uint8_t)(sVar75 - sVar66 >> 8);
      sendbuf->base[sVar66 - 1] = (uint8_t)(sVar75 - sVar66);
      ikm.len = ecdh_secret.len;
      ikm.base = ecdh_secret.base;
      key_schedule_extract(tls->key_schedule,ikm);
      aVar42 = setup_traffic_protection(tls,tls->cipher_suite,1,"server handshake traffic secret");
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      psVar51 = (tls->field_7).server.early_data;
      if (psVar51 == (st_ptls_early_data_receiver_t *)0x0) {
        aVar42 = setup_traffic_protection(tls,tls->cipher_suite,0,"client handshake traffic secret")
        ;
        uVar35 = finished_key._0_8_;
        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
          if (local_214 != 0) {
            paVar2 = &(tls->field_7).server;
            *(byte *)paVar2 = *(byte *)paVar2 | 2;
          }
          goto LAB_0010fde4;
        }
        goto LAB_0010dfd2;
      }
      aVar42 = derive_secret(tls->key_schedule,psVar51,"client handshake traffic secret");
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
LAB_0010fde4:
      sVar66 = sendbuf->off;
      _max_early_data_size = (ushort *)CONCAT53(stack0xfffffffffffffc3b,0x10316);
      aVar42 = ptls_buffer__do_pushv(sendbuf,&max_early_data_size,3);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      sVar75 = sendbuf->off;
      local_4aa = 8;
      aVar42 = ptls_buffer__do_pushv(sendbuf,&local_4aa,1);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      aVar42 = ptls_buffer__do_pushv(sendbuf,"",3);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      sVar73 = sendbuf->off;
      aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      sVar74 = sendbuf->off;
      if (tls->server_name != (char *)0x0) {
        local_466 = 0;
        aVar42 = ptls_buffer__do_pushv(sendbuf,&local_466,2);
        uVar35 = finished_key._0_8_;
        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
          aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
          uVar35 = finished_key._0_8_;
          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
            sVar62 = sendbuf->off;
            for (; lVar53 != 0; lVar53 = lVar53 + 1) {
              sendbuf->base[lVar53 + sVar62] = '\0';
            }
            goto LAB_0010ff28;
          }
        }
        goto LAB_0010dfd2;
      }
LAB_0010ff28:
      if (((tls->field_7).server.early_data != (st_ptls_early_data_receiver_t *)0x0) &&
         ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
        local_468 = 0x2a00;
        aVar42 = ptls_buffer__do_pushv(sendbuf,&local_468,2);
        uVar35 = finished_key._0_8_;
        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
          aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
          uVar35 = finished_key._0_8_;
          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
            sVar62 = sendbuf->off;
            for (lVar53 = -2; lVar53 != 0; lVar53 = lVar53 + 1) {
              sendbuf->base[lVar53 + sVar62] = '\0';
            }
            goto LAB_0010ff9c;
          }
        }
        goto LAB_0010dfd2;
      }
LAB_0010ff9c:
      lVar53 = sendbuf->off - sVar74;
      sendbuf->base[sVar74 - 2] = (uint8_t)((ulong)lVar53 >> 8);
      sendbuf->base[sVar74 - 1] = (uint8_t)lVar53;
      uVar70 = sendbuf->off - sVar73;
      for (lVar53 = 0x10; lVar53 != -8; lVar53 = lVar53 + -8) {
        sendbuf->base[sVar73 - 3] = (uint8_t)(uVar70 >> ((byte)lVar53 & 0x3f));
        sVar73 = sVar73 + 1;
      }
      sVar73 = sendbuf->off;
      if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
        psVar4 = tls->key_schedule->msghash;
        (*psVar4->update)(psVar4,sendbuf->base + sVar75,sVar73 - sVar75);
        sVar73 = sendbuf->off;
      }
      sendbuf->base[sVar75 - 2] = (uint8_t)(sVar73 - sVar75 >> 8);
      sendbuf->base[sVar75 - 1] = (uint8_t)(sVar73 - sVar75);
      aVar42 = buffer_encrypt_record(sendbuf,sVar66,(tls->traffic_protection).enc.aead);
      uVar35 = finished_key._0_8_;
      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
      if (bVar21) {
        sVar66 = sendbuf->off;
        _group = (uint8_t *)CONCAT53(uStack_3e6._1_5_,0x10316);
        aVar42 = ptls_buffer__do_pushv(sendbuf,&group,3);
        uVar35 = finished_key._0_8_;
        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
          aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
          uVar35 = finished_key._0_8_;
          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
            sVar75 = sendbuf->off;
            local_4ab = 0xb;
            aVar42 = ptls_buffer__do_pushv(sendbuf,&local_4ab,1);
            uVar35 = finished_key._0_8_;
            if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
              aVar42 = ptls_buffer__do_pushv(sendbuf,"",3);
              uVar35 = finished_key._0_8_;
              if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                sVar73 = sendbuf->off;
                local_4ac = 0;
                aVar42 = ptls_buffer__do_pushv(sendbuf,&local_4ac,1);
                uVar35 = finished_key._0_8_;
                if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                  aVar42 = ptls_buffer__do_pushv(sendbuf,"",3);
                  uVar35 = finished_key._0_8_;
                  if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                    sVar74 = sendbuf->off;
                    for (sVar62 = 0; sVar62 != num_certs; sVar62 = sVar62 + 1) {
                      aVar42 = ptls_buffer__do_pushv(sendbuf,"",3);
                      uVar35 = finished_key._0_8_;
                      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
                      sVar71 = sendbuf->off;
                      aVar42 = ptls_buffer__do_pushv(sendbuf,certs[sVar62].base,certs[sVar62].len);
                      uVar35 = finished_key._0_8_;
                      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
                      uVar70 = sendbuf->off - sVar71;
                      for (lVar53 = 0x10; lVar53 != -8; lVar53 = lVar53 + -8) {
                        sendbuf->base[sVar71 - 3] = (uint8_t)(uVar70 >> ((byte)lVar53 & 0x3f));
                        sVar71 = sVar71 + 1;
                      }
                      aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
                      uVar35 = finished_key._0_8_;
                      if (aVar42 != PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010dfd2;
                      sVar71 = sendbuf->off;
                      for (lVar53 = -2; lVar53 != 0; lVar53 = lVar53 + 1) {
                        sendbuf->base[lVar53 + sVar71] = '\0';
                      }
                    }
                    uVar70 = sendbuf->off - sVar74;
                    for (lVar53 = 0x10; lVar53 != -8; lVar53 = lVar53 + -8) {
                      sendbuf->base[sVar74 - 3] = (uint8_t)(uVar70 >> ((byte)lVar53 & 0x3f));
                      sVar74 = sVar74 + 1;
                    }
                    uVar70 = sendbuf->off - sVar73;
                    for (lVar53 = 0x10; lVar53 != -8; lVar53 = lVar53 + -8) {
                      sendbuf->base[sVar73 - 3] = (uint8_t)(uVar70 >> ((byte)lVar53 & 0x3f));
                      sVar73 = sVar73 + 1;
                    }
                    sVar73 = sendbuf->off;
                    if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                      psVar4 = tls->key_schedule->msghash;
                      (*psVar4->update)(psVar4,sendbuf->base + sVar75,sVar73 - sVar75);
                      sVar73 = sendbuf->off;
                    }
                    sendbuf->base[sVar75 - 2] = (uint8_t)(sVar73 - sVar75 >> 8);
                    sendbuf->base[sVar75 - 1] = (uint8_t)(sVar73 - sVar75);
                    aVar42 = buffer_encrypt_record
                                       (sendbuf,sVar66,(tls->traffic_protection).enc.aead);
                    uVar35 = finished_key._0_8_;
                    if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                      sVar66 = sendbuf->off;
                      ticket_psk.base._0_2_ = 0x316;
                      ticket_psk.base._2_1_ = 1;
                      aVar42 = ptls_buffer__do_pushv(sendbuf,&ticket_psk,3);
                      uVar35 = finished_key._0_8_;
                      if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                        aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
                        uVar35 = finished_key._0_8_;
                        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                          sVar75 = sendbuf->off;
                          local_4ad = 0xf;
                          aVar42 = ptls_buffer__do_pushv(sendbuf,&local_4ad,1);
                          uVar35 = finished_key._0_8_;
                          if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                            aVar42 = ptls_buffer__do_pushv(sendbuf,"",3);
                            uVar35 = finished_key._0_8_;
                            if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                              sVar73 = sendbuf->off;
                              local_46a = sign_algorithm << 8 | sign_algorithm >> 8;
                              aVar42 = ptls_buffer__do_pushv(sendbuf,&local_46a,2);
                              uVar35 = finished_key._0_8_;
                              if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                                aVar42 = ptls_buffer__do_pushv(sendbuf,"",2);
                                uVar35 = finished_key._0_8_;
                                if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                                  sVar74 = sendbuf->off;
                                  sVar62 = build_certificate_verify_signdata
                                                     (finished_key,tls->key_schedule,context_string)
                                  ;
                                  pVar79.len = sVar62;
                                  pVar79.base = finished_key;
                                  aVar42 = (*signer)(signer_data,sendbuf,pVar79);
                                  uVar35 = finished_key._0_8_;
                                  if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
                                    lVar53 = sendbuf->off - sVar74;
                                    sendbuf->base[sVar74 - 2] = (uint8_t)((ulong)lVar53 >> 8);
                                    sendbuf->base[sVar74 - 1] = (uint8_t)lVar53;
                                    uVar70 = sendbuf->off - sVar73;
                                    for (lVar53 = 0x10; lVar53 != -8; lVar53 = lVar53 + -8) {
                                      sendbuf->base[sVar73 - 3] =
                                           (uint8_t)(uVar70 >> ((byte)lVar53 & 0x3f));
                                      sVar73 = sVar73 + 1;
                                    }
                                    sVar73 = sendbuf->off;
                                    if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                                      psVar4 = tls->key_schedule->msghash;
                                      (*psVar4->update)(psVar4,sendbuf->base + sVar75,
                                                        sVar73 - sVar75);
                                      sVar73 = sendbuf->off;
                                    }
                                    sendbuf->base[sVar75 - 2] = (uint8_t)(sVar73 - sVar75 >> 8);
                                    sendbuf->base[sVar75 - 1] = (uint8_t)(sVar73 - sVar75);
                                    aVar42 = buffer_encrypt_record
                                                       (sendbuf,sVar66,
                                                        (tls->traffic_protection).enc.aead);
                                    uVar35 = finished_key._0_8_;
                                    if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START)
                                    goto LAB_00110463;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_0010dfd2;
      }
LAB_00110463:
      send_finished(tls,sendbuf);
      aVar42 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      uVar24 = finished_key._0_8_;
      if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
        aVar42 = setup_traffic_protection
                           (tls,tls->cipher_suite,1,"server application traffic secret");
        uVar24 = finished_key._0_8_;
        if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
          tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          uVar35 = finished_key._0_8_;
          aVar42 = PTLS_STATE_CLIENT_HANDSHAKE_START;
          goto LAB_0010dfd2;
        }
      }
      goto switchD_0010db48_caseD_a;
    }
    psVar51 = (st_ptls_early_data_receiver_t *)malloc(0x40);
    (tls->field_7).server.early_data = psVar51;
    if (psVar51 == (st_ptls_early_data_receiver_t *)0x0) {
      uVar35 = finished_key._0_8_;
      aVar42 = 0x201;
    }
    else {
      aVar42 = setup_traffic_protection(tls,tls->cipher_suite,0,"client early traffic secret");
      uVar35 = finished_key._0_8_;
      if (aVar42 == PTLS_STATE_CLIENT_HANDSHAKE_START) goto LAB_0010f5d6;
    }
  }
LAB_0010dfd2:
  finished_key._0_8_ = uVar35;
  free(pubkey.base);
  free(ecdh_secret.base);
  (*ptls_clear_memory)(finished_key,0x40);
  uVar24 = finished_key._0_8_;
  goto switchD_0010db48_caseD_a;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (tls->traffic_protection.dec.aead != NULL) {
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = ptls_aead_transform(tls->traffic_protection.dec.aead, decryptbuf->base + decryptbuf->off, &rec.length,
                                       rec.fragment, rec.length, 0)) != 0) {
            if (tls->server.skip_early_data) {
                ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
                goto NextRecord;
            }
            return ret;
        }
        tls->server.skip_early_data = 0;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {

        /* handshake */
        ptls_iovec_t message = {NULL};
        if (rec.type != PTLS_CONTENT_TYPE_HANDSHAKE)
            return PTLS_ALERT_DECODE_ERROR;

        /* handle the record directly, or buffer the message split into multiple records */
        if (tls->recvbuf.mess.base == NULL && test_handshake_message(rec.fragment, rec.length) == 0) {
            message = ptls_iovec_init(rec.fragment, rec.length);
        } else {
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec.length)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec.fragment, rec.length);
            tls->recvbuf.mess.off += rec.length;
            if ((ret = test_handshake_message(tls->recvbuf.mess.base, tls->recvbuf.mess.off)) == 0)
                message = ptls_iovec_init(tls->recvbuf.mess.base, tls->recvbuf.mess.off);
        }

        /* handle the complete message, if available */
        if (message.base != NULL) {
            ret = handle_handshake_message(tls, sendbuf, message, properties);
            ptls_buffer_dispose(&tls->recvbuf.mess);
        }

    } else {

        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_FINISHED) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;
}